

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

st__table * Extra_bddNodePathsUnderCut(DdManager *dd,DdNode *bFunc,int CutLevel)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  char *local_80;
  DdNode *bSum;
  DdNode *bNode;
  DdNode *aNode_1;
  st__generator *gen_1;
  traventry *p;
  DdNode *aNode;
  st__generator *gen;
  DdNode *aFunc;
  st__table *Result;
  st__table *CutNodes;
  st__table *Visited;
  DdNode *pDStack_20;
  int CutLevel_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  s_CutLevel = CutLevel;
  Visited._4_4_ = CutLevel;
  pDStack_20 = bFunc;
  bFunc_local = &dd->sentinel;
  aFunc = (DdNode *)st__init_table(st__ptrcmp,st__ptrhash);
  if (*(int *)((ulong)pDStack_20 & 0xfffffffffffffffe) == 0x7fffffff) {
    if (pDStack_20 == *(DdNode **)(bFunc_local + 1)) {
      st__insert((st__table *)aFunc,*(char **)(bFunc_local + 1),*(char **)(bFunc_local + 1));
      Cudd_Ref(*(DdNode **)(bFunc_local + 1));
      Cudd_Ref(*(DdNode **)(bFunc_local + 1));
    }
    else {
      uVar1._0_4_ = bFunc_local[1].index;
      uVar1._4_4_ = bFunc_local[1].ref;
      uVar2._0_4_ = bFunc_local[1].index;
      uVar2._4_4_ = bFunc_local[1].ref;
      st__insert((st__table *)aFunc,(char *)(uVar1 ^ 1),(char *)(uVar2 ^ 1));
      uVar3._0_4_ = bFunc_local[1].index;
      uVar3._4_4_ = bFunc_local[1].ref;
      Cudd_Ref((DdNode *)(uVar3 ^ 1));
      uVar4._0_4_ = bFunc_local[1].index;
      uVar4._4_4_ = bFunc_local[1].ref;
      Cudd_Ref((DdNode *)(uVar4 ^ 1));
    }
    dd_local = (DdManager *)aFunc;
  }
  else {
    gen = (st__generator *)Cudd_BddToAdd((DdManager *)bFunc_local,pDStack_20);
    Cudd_Ref((DdNode *)gen);
    CutNodes = st__init_table(st__ptrcmp,st__ptrhash);
    Result = st__init_table(st__ptrcmp,st__ptrhash);
    CountNodeVisits_rec((DdManager *)bFunc_local,(DdNode *)gen,CutNodes);
    CollectNodesAndComputePaths_rec
              ((DdManager *)bFunc_local,(DdNode *)gen,*(DdNode **)(bFunc_local + 1),CutNodes,Result)
    ;
    aNode = (DdNode *)st__init_gen(CutNodes);
    while (iVar5 = st__gen((st__generator *)aNode,(char **)&p,(char **)&gen_1), iVar5 != 0) {
      Cudd_RecursiveDeref((DdManager *)bFunc_local,(DdNode *)gen_1->entry);
      if (gen_1 != (st__generator *)0x0) {
        free(gen_1);
        gen_1 = (st__generator *)0x0;
      }
    }
    st__free_gen((st__generator *)aNode);
    st__free_table(CutNodes);
    aNode_1 = (DdNode *)st__init_gen(Result);
    while (iVar5 = st__gen((st__generator *)aNode_1,(char **)&bNode,&local_80), iVar5 != 0) {
      bSum = Cudd_addBddPattern((DdManager *)bFunc_local,bNode);
      Cudd_Ref(bSum);
      st__insert((st__table *)aFunc,(char *)bSum,local_80);
    }
    st__free_gen((st__generator *)aNode_1);
    st__free_table(Result);
    Cudd_RecursiveDeref((DdManager *)bFunc_local,(DdNode *)gen);
    dd_local = (DdManager *)aFunc;
  }
  return (st__table *)dd_local;
}

Assistant:

st__table * Extra_bddNodePathsUnderCut( DdManager * dd, DdNode * bFunc, int CutLevel )
{
    st__table * Visited;  // temporary table to remember the visited nodes
    st__table * CutNodes; // the result goes here
    st__table * Result; // the result goes here
    DdNode * aFunc;

    s_CutLevel = CutLevel;

    Result  = st__init_table( st__ptrcmp, st__ptrhash);;
    // the terminal cases
    if ( Cudd_IsConstant( bFunc ) )
    {
        if ( bFunc == b1 )
        {
            st__insert( Result, (char*)b1, (char*)b1 );
            Cudd_Ref( b1 );
            Cudd_Ref( b1 );
        }
        else
        {
            st__insert( Result, (char*)b0, (char*)b0 );
            Cudd_Ref( b0 );
            Cudd_Ref( b0 );
        }
        return Result;
    }

    // create the ADD to simplify processing (no complemented edges)
    aFunc = Cudd_BddToAdd( dd, bFunc );   Cudd_Ref( aFunc );

    // Step 1: Start the tables and collect information about the nodes above the cut 
    // this information tells how many edges point to each node
    Visited  = st__init_table( st__ptrcmp, st__ptrhash);;
    CutNodes = st__init_table( st__ptrcmp, st__ptrhash);;

    CountNodeVisits_rec( dd, aFunc, Visited );

    // Step 2: Traverse the BDD using the visited table and compute the sum of paths
    CollectNodesAndComputePaths_rec( dd, aFunc, b1, Visited, CutNodes );

    // at this point the table of cut nodes is ready and the table of visited is useless
    {
        st__generator * gen;
        DdNode * aNode;
        traventry * p;
        st__foreach_item( Visited, gen, (const char**)&aNode, (char**)&p )
        {
            Cudd_RecursiveDeref( dd, p->bSum );
            ABC_FREE( p );
        }
        st__free_table( Visited );
    }

    // go through the table CutNodes and create the BDD and the path to be returned
    {
        st__generator * gen;
        DdNode * aNode, * bNode, * bSum;
        st__foreach_item( CutNodes, gen, (const char**)&aNode, (char**)&bSum)
        {
            // aNode is not referenced, because aFunc is holding it
            bNode = Cudd_addBddPattern( dd, aNode );  Cudd_Ref( bNode ); 
            st__insert( Result, (char*)bNode, (char*)bSum );
            // the new table takes both refs
        }
        st__free_table( CutNodes );
    }

    // dereference the ADD
    Cudd_RecursiveDeref( dd, aFunc );

    // return the table
    return Result;

}